

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O0

void dragon_shield_check(int *shield,int *damage)

{
  ostream *poVar1;
  int *damage_local;
  int *shield_local;
  
  *shield = *shield - *damage;
  if (*shield < 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c82d);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*shield + *damage);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_c801);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    *damage = -*shield;
    *shield = 0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c82d);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*damage);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_c801);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    *damage = 0;
  }
  return;
}

Assistant:

void dragon_shield_check(int* shield,int* damage){
	*shield -= *damage;
	if(*shield<0){
		cout<<"(龍盾吸收了 "<<*shield + *damage<<" 點傷害)"<<endl;
		*damage = -*shield;
		*shield=0;
	}
	else {
		cout<<"(龍盾吸收了 "<<*damage<<" 點傷害)"<<endl;
		*damage=0;
	}
}